

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

SolverOption * __thiscall
mp::SolverOptionManager::FindOption(SolverOptionManager *this,char *name,bool wildcardvalues)

{
  bool bVar1;
  const_iterator key;
  reference ppSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__s;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  byte in_DL;
  const_iterator i_1;
  string name_str;
  const_iterator i;
  DummyOption option;
  set<mp::SolverOption_*,_mp::SolverOptionManager::OptionNameLess,_std::allocator<mp::SolverOption_*>_>
  *in_stack_fffffffffffffdd8;
  undefined6 in_stack_fffffffffffffde0;
  byte in_stack_fffffffffffffde6;
  undefined1 in_stack_fffffffffffffde7;
  anon_class_8_1_55a64ffb_for__M_pred in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  undefined5 in_stack_fffffffffffffe58;
  byte bVar4;
  byte bVar5;
  _Alloc_hider in_stack_fffffffffffffe5f;
  string local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  string *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  _Self local_158;
  _Self local_150;
  allocator<char> local_141;
  string local_140 [36];
  undefined4 local_11c;
  _Self local_118 [3];
  undefined1 *local_100;
  _Self local_f8;
  undefined1 local_f0 [215];
  byte local_19;
  SolverOption *local_8;
  
  local_19 = in_DL & 1;
  FindOption::DummyOption::DummyOption
            ((DummyOption *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (char *)in_stack_fffffffffffffdf8.name_str);
  local_100 = local_f0;
  key = std::
        set<mp::SolverOption_*,_mp::SolverOptionManager::OptionNameLess,_std::allocator<mp::SolverOption_*>_>
        ::find(in_stack_fffffffffffffdd8,(key_type *)0x6e8e9c);
  local_f8._M_node = key._M_node;
  local_118[0]._M_node =
       (_Base_ptr)
       std::
       set<mp::SolverOption_*,_mp::SolverOptionManager::OptionNameLess,_std::allocator<mp::SolverOption_*>_>
       ::end(in_stack_fffffffffffffdd8);
  bVar1 = std::operator!=(&local_f8,local_118);
  if (bVar1) {
    std::_Rb_tree_const_iterator<mp::SolverOption_*>::operator*
              ((_Rb_tree_const_iterator<mp::SolverOption_*> *)0x6e8ef1);
    bVar1 = SolverOption::is_wildcard((SolverOption *)0x6e8ef9);
    if ((bVar1) && ((local_19 & 1) != 0)) {
      local_8 = (SolverOption *)0x0;
      local_11c = 1;
    }
    else {
      ppSVar2 = std::_Rb_tree_const_iterator<mp::SolverOption_*>::operator*
                          ((_Rb_tree_const_iterator<mp::SolverOption_*> *)0x6e8f55);
      local_8 = *ppSVar2;
      local_11c = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::allocator<char>::~allocator(&local_141);
    local_150._M_node =
         (_Base_ptr)
         std::
         set<mp::SolverOption_*,_mp::SolverOptionManager::OptionNameLess,_std::allocator<mp::SolverOption_*>_>
         ::begin(in_stack_fffffffffffffdd8);
    while( true ) {
      local_158._M_node =
           (_Base_ptr)
           std::
           set<mp::SolverOption_*,_mp::SolverOptionManager::OptionNameLess,_std::allocator<mp::SolverOption_*>_>
           ::end(in_stack_fffffffffffffdd8);
      bVar1 = std::operator!=(&local_150,&local_158);
      if (!bVar1) break;
      ppSVar2 = std::_Rb_tree_const_iterator<mp::SolverOption_*>::operator*
                          ((_Rb_tree_const_iterator<mp::SolverOption_*> *)0x6e900c);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                SolverOption::inline_synonyms_abi_cxx11_(*ppSVar2);
      local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffdd8);
      ppSVar2 = std::_Rb_tree_const_iterator<mp::SolverOption_*>::operator*
                          ((_Rb_tree_const_iterator<mp::SolverOption_*> *)0x6e903a);
      __s = SolverOption::inline_synonyms_abi_cxx11_(*ppSVar2);
      local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffdd8);
      local_178 = local_140;
      _Var3._M_current._7_1_ = in_stack_fffffffffffffe07;
      _Var3._M_current._0_7_ = in_stack_fffffffffffffe00;
      _Var3 = std::
              find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,mp::SolverOptionManager::FindOption(char_const*,bool)const::__0>
                        (in_stack_fffffffffffffe08,_Var3,in_stack_fffffffffffffdf8);
      local_160 = _Var3._M_current;
      ppSVar2 = std::_Rb_tree_const_iterator<mp::SolverOption_*>::operator*
                          ((_Rb_tree_const_iterator<mp::SolverOption_*> *)0x6e90a9);
      in_stack_fffffffffffffe08._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           SolverOption::inline_synonyms_abi_cxx11_(*ppSVar2);
      local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffdd8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffde7,
                                     CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)),
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffdd8);
      if (bVar1) {
        ppSVar2 = std::_Rb_tree_const_iterator<mp::SolverOption_*>::operator*
                            ((_Rb_tree_const_iterator<mp::SolverOption_*> *)0x6e90f2);
        local_8 = *ppSVar2;
        goto LAB_006e92e7;
      }
      bVar5 = 0;
      bVar4 = 0;
      in_stack_fffffffffffffde6 = false;
      if ((local_19 & 1) != 0) {
        std::_Rb_tree_const_iterator<mp::SolverOption_*>::operator*
                  ((_Rb_tree_const_iterator<mp::SolverOption_*> *)0x6e917b);
        in_stack_fffffffffffffdf8.name_str = (string *)&stack0xfffffffffffffe5f;
        std::allocator<char>::allocator();
        bVar5 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)__s,(allocator<char> *)_Var3._M_current);
        bVar4 = 1;
        in_stack_fffffffffffffde7 =
             SolverOption::wc_match
                       ((SolverOption *)
                        CONCAT17(in_stack_fffffffffffffe5f,
                                 CONCAT16(bVar5,CONCAT15(1,in_stack_fffffffffffffe58))),
                        (string *)key._M_node);
        in_stack_fffffffffffffde6 = in_stack_fffffffffffffde7;
      }
      in_stack_fffffffffffffe07 = in_stack_fffffffffffffde6;
      if ((bVar4 & 1) != 0) {
        std::__cxx11::string::~string(local_1a0);
      }
      if ((bVar5 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe5f);
      }
      if ((in_stack_fffffffffffffde6 & 1) != 0) {
        ppSVar2 = std::_Rb_tree_const_iterator<mp::SolverOption_*>::operator*
                            ((_Rb_tree_const_iterator<mp::SolverOption_*> *)0x6e9241);
        local_8 = *ppSVar2;
        goto LAB_006e92e7;
      }
      std::_Rb_tree_const_iterator<mp::SolverOption_*>::operator++
                ((_Rb_tree_const_iterator<mp::SolverOption_*> *)
                 CONCAT17(in_stack_fffffffffffffde7,
                          CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)));
    }
    local_8 = (SolverOption *)0x0;
LAB_006e92e7:
    local_11c = 1;
    std::__cxx11::string::~string(local_140);
  }
  FindOption::DummyOption::~DummyOption((DummyOption *)0x6e9312);
  return local_8;
}

Assistant:

SolverOption *SolverOptionManager::FindOption(
    const char *name, bool wildcardvalues) const {
  struct DummyOption : SolverOption {
    DummyOption(const char *name) : SolverOption(name, "") {}
    void Write(fmt::Writer &) {}
    void Parse(const char *&, bool) {}
    Option_Type type() {
      return Option_Type::BOOL;
    }
  };
  DummyOption option(name);
  // find by name
  OptionSet::const_iterator i = options_.find(&option);
  if (i != options_.end()) {
    if ((*i)->is_wildcard() && wildcardvalues)
      return 0;
    return *i;
  }

  // find by inline synonyms and wildcards. Case-insensitive
  std::string name_str {name};
  for (OptionSet::const_iterator i = options_.begin();
    i != options_.end(); ++i)
  {
    if (std::find_if((*i)->inline_synonyms().begin(),
                    (*i)->inline_synonyms().end(),
                    [&name_str](const std::string& syn) {
                     return 0==strcasecmp(name_str.c_str(), syn.c_str()); } ) !=
        (*i)->inline_synonyms().end()) {
      return *i;
    }
    /// Wildcards
    if (wildcardvalues && (*i)->wc_match(name))
      return *i;
  }
  return 0;
}